

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRun.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool testTimeTrace;
  int iVar1;
  bool runSpeedTests;
  bool testTranslationSave;
  bool testOutput;
  bool testTranslation;
  ulong uVar2;
  bool verbose;
  
  if (argc < 2) {
    verbose = false;
    runSpeedTests = false;
    testOutput = false;
    testTranslationSave = false;
    testTranslation = false;
    testTimeTrace = false;
  }
  else {
    uVar2 = 1;
    testTimeTrace = false;
    testTranslation = false;
    testTranslationSave = false;
    testOutput = false;
    runSpeedTests = false;
    verbose = false;
    do {
      __s1 = argv[uVar2];
      iVar1 = strcmp(__s1,"--verbose");
      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"-v"), iVar1 == 0)) {
        verbose = true;
      }
      else {
        iVar1 = strcmp(__s1,"--speed");
        if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"-s"), iVar1 == 0)) {
          runSpeedTests = true;
        }
        else {
          iVar1 = strcmp(__s1,"--output");
          if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"-o"), iVar1 == 0)) {
            testOutput = true;
          }
          else {
            iVar1 = strcmp(__s1,"--translate");
            if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"-t"), iVar1 == 0)) {
              testTranslationSave = true;
            }
            else {
              iVar1 = strcmp(__s1,"--executable");
              if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"-e"), iVar1 == 0)) {
                testTranslation = true;
              }
              else {
                iVar1 = strcmp(__s1,"--time-trace");
                if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"-r"), iVar1 == 0)) {
                  testTimeTrace = true;
                }
              }
            }
          }
        }
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  iVar1 = RunTests(verbose,(_func_char_ptr_char_ptr_uint_ptr *)0x0,(_func_void_char_ptr *)0x0,
                   runSpeedTests,testOutput,testTranslationSave,testTranslation,testTimeTrace);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
	(void)argv;

	bool verbose = false;
	bool runSpeedTests = false;
	bool testOutput = false;
	bool testTranslationSave = false;
	bool testTranslation = false;
	bool testTimeTrace = false;

	for(int i = 1; i < argc; i++)
	{
		if(strcmp(argv[i], "--verbose") == 0 || strcmp(argv[i], "-v") == 0)
			verbose = true;
		else if(strcmp(argv[i], "--speed") == 0 || strcmp(argv[i], "-s") == 0)
			runSpeedTests = true;
		else if(strcmp(argv[i], "--output") == 0 || strcmp(argv[i], "-o") == 0)
			testOutput = true;
		else if(strcmp(argv[i], "--translate") == 0 || strcmp(argv[i], "-t") == 0)
			testTranslationSave = true;
		else if(strcmp(argv[i], "--executable") == 0 || strcmp(argv[i], "-e") == 0)
			testTranslation = true;
		else if(strcmp(argv[i], "--time-trace") == 0 || strcmp(argv[i], "-r") == 0)
			testTimeTrace = true;
	}

	return RunTests(verbose, 0, 0, runSpeedTests, testOutput, testTranslationSave, testTranslation, testTimeTrace);
}